

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

string * __thiscall
deqp::sl::ShaderCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  pointer pVVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  int ndx_1;
  int ndx;
  long lVar5;
  ulong uVar6;
  long lVar7;
  string *psVar8;
  char *local_1c0;
  char *local_1b8;
  ostringstream res;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  uVar6 = (ulong)this->m_targetVersion;
  if (uVar6 < 7) {
    local_1b8 = *(char **)(&DAT_01dfe020 + uVar6 * 8);
    local_1c0 = *(char **)(&DAT_01dfe058 + uVar6 * 8);
  }
  else {
    local_1c0 = "out";
    local_1b8 = "in";
  }
  pcVar3 = glu::getGLSLVersionDeclaration(this->m_targetVersion);
  poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
  std::operator<<(poVar4,"\n");
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"precision highp float;\n"
                 );
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"precision highp int;\n");
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,local_1b8);
  std::operator<<(poVar4," highp vec4 dEQP_Position;\n");
  lVar7 = 0x28;
  lVar5 = 0;
  while( true ) {
    pVVar1 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48) <= lVar5)
    break;
    if (*(int *)((long)pVVar1 + lVar7 + -0x28) == 1) {
      DVar2 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar1->storageType + lVar7));
      pcVar3 = glu::getDataTypeName(DVar2);
      poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,local_1b8);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4," a_");
      psVar8 = (string *)((long)pVVar1 + lVar7 + -0x20);
      poVar4 = std::operator<<(poVar4,psVar8);
      std::operator<<(poVar4,";\n");
      DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar1->storageType + lVar7));
      if (DVar2 == TYPE_FLOAT) {
        poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,local_1c0);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        pcVar3 = " ";
      }
      else {
        poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,local_1c0);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        pcVar3 = " v_";
      }
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,psVar8);
      std::operator<<(poVar4,";\n");
    }
    lVar5 = lVar5 + 1;
    lVar7 = lVar7 + 0x48;
  }
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,
                  "    gl_Position = dEQP_Position;\n");
  lVar5 = 0;
  lVar7 = 0;
  while( true ) {
    pVVar1 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48) <= lVar7)
    break;
    if (*(int *)((long)&pVVar1->storageType + lVar5) == 1) {
      DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar1->dataType + lVar5));
      pcVar3 = "    ";
      if (DVar2 != TYPE_FLOAT) {
        pcVar3 = "    v_";
      }
      poVar4 = std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
      psVar8 = (string *)((long)&(pVVar1->valueName)._M_dataplus._M_p + lVar5);
      poVar4 = std::operator<<(poVar4,psVar8);
      poVar4 = std::operator<<(poVar4," = a_");
      poVar4 = std::operator<<(poVar4,psVar8);
      std::operator<<(poVar4,";\n");
    }
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0x48;
  }
  std::operator<<(&res.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  return __return_storage_ptr__;
}

Assistant:

string ShaderCase::genVertexShader(const ValueBlock& valueBlock)
{
	ostringstream res;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	res << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			DataType	floatType = getDataTypeFloatScalars(val.dataType);
			const char* typeStr   = getDataTypeName(floatType);
			res << vtxIn << " " << typeStr << " a_" << val.valueName << ";\n";

			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << vtxOut << " " << typeStr << " " << val.valueName << ";\n";
			else
				res << vtxOut << " " << typeStr << " v_" << val.valueName << ";\n";
		}
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "    gl_Position = dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			const string& name = val.valueName;
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << "    " << name << " = a_" << name << ";\n";
			else
				res << "    v_" << name << " = a_" << name << ";\n";
		}
	}

	res << "}\n";
	return res.str();
}